

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::runPass(PassRunner *this,Pass *pass)

{
  int iVar1;
  size_type sVar2;
  PassRunner *pPVar3;
  Pass *pass_local;
  PassRunner *this_local;
  
  iVar1 = (*pass->_vptr_Pass[4])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                  ,0x3cf,"void wasm::PassRunner::runPass(Pass *)");
  }
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(this->options).passesToSkip,&pass->name);
  if (sVar2 == 0) {
    pPVar3 = Pass::getPassRunner(pass);
    if (pPVar3 != (PassRunner *)0x0) {
      __assert_fail("!pass->getPassRunner()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                    ,0x3d7,"void wasm::PassRunner::runPass(Pass *)");
    }
    Pass::setPassRunner(pass,this);
    (*pass->_vptr_Pass[2])(pass,this->wasm);
    handleAfterEffects(this,pass,(Function *)0x0);
  }
  return;
}

Assistant:

void PassRunner::runPass(Pass* pass) {
  assert(!pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    return;
  }

  // Passes can only be run once and we deliberately do not clear the pass
  // runner after running the pass, so there must not already be a runner here.
  assert(!pass->getPassRunner());
  pass->setPassRunner(this);
  pass->run(wasm);
  handleAfterEffects(pass);
}